

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

ALLEGRO_SHADER * al_create_shader(ALLEGRO_SHADER_PLATFORM platform)

{
  _Bool _Var1;
  ALLEGRO_SHADER_PLATFORM AVar2;
  _AL_LIST_ITEM *p_Var3;
  _func_void_void_ptr *unaff_retaddr;
  ALLEGRO_SHADER *shader;
  undefined4 in_stack_00000010;
  _AL_DTOR_LIST *in_stack_00000018;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  ALLEGRO_SHADER *pAVar4;
  
  pAVar4 = (ALLEGRO_SHADER *)0x0;
  AVar2 = resolve_platform(ALLEGRO_SHADER_AUTO);
  if (AVar2 == ALLEGRO_SHADER_GLSL) {
    pAVar4 = _al_create_shader_glsl(ALLEGRO_SHADER_GLSL);
  }
  if (pAVar4 == (ALLEGRO_SHADER *)0x0) {
    _Var1 = _al_trace_prefix(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034
                             ,in_stack_00000028);
    if (_Var1) {
      _al_trace_suffix("Failed to create shader\n");
    }
  }
  else {
    p_Var3 = _al_register_destructor
                       (in_stack_00000018,(char *)CONCAT44(platform,in_stack_00000010),shader,
                        unaff_retaddr);
    pAVar4->dtor_item = p_Var3;
  }
  return pAVar4;
}

Assistant:

ALLEGRO_SHADER *al_create_shader(ALLEGRO_SHADER_PLATFORM platform)
{
   ALLEGRO_SHADER *shader = NULL;

   platform = resolve_platform(platform);

   if (false) {
   }
#ifdef ALLEGRO_CFG_SHADER_GLSL
   else if (platform == ALLEGRO_SHADER_GLSL) {
      shader = _al_create_shader_glsl(platform);
   }
#endif
#ifdef ALLEGRO_CFG_SHADER_HLSL
   else if (platform == ALLEGRO_SHADER_HLSL) {
      shader = _al_create_shader_hlsl(platform);
   }
#endif

   if (shader) {
      ASSERT(shader->platform);
      ASSERT(shader->vt);
      shader->dtor_item = _al_register_destructor(_al_dtor_list, "shader", shader,
         (void (*)(void *))al_destroy_shader);
   }
   else {
      ALLEGRO_WARN("Failed to create shader\n");
   }
   return shader;
}